

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void __thiscall r_exec::View::delete_from_object(View *this)

{
  _Object *p_Var1;
  _func_int **pp_Var2;
  
  (*((this->super_View).object.object)->_vptr__Object[0x11])();
  std::
  _Hashtable<r_code::View_*,_r_code::View_*,_std::allocator<r_code::View_*>,_std::__detail::_Identity,_r_code::View::Equal,_r_code::View::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_M_erase((_Hashtable<r_code::View_*,_r_code::View_*,_std::allocator<r_code::View_*>,_std::__detail::_Identity,_r_code::View::Equal,_r_code::View::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&(this->super_View).object.object[5].refCount);
  p_Var1 = (this->super_View).object.object;
  pp_Var2 = p_Var1[7]._vptr__Object;
  (*p_Var1->_vptr__Object[0x12])();
  if (pp_Var2 == (_func_int **)0x0) {
    (*((this->super_View).object.object)->_vptr__Object[0xf])();
  }
  return;
}

Assistant:

void View::delete_from_object()
{
    object->acq_views();
    object->views.erase(this);

    if (object->views.size() == 0) {
        object->rel_views(); // avoid deadlock
        object->invalidate();
    } else {
        object->rel_views();
    }
}